

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

int AF_DBlockThingsIterator_Next
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  int iVar3;
  PClass *pPVar4;
  char *__assertion;
  bool bVar5;
  
  pPVar2 = DBlockThingsIterator::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    puVar1 = (undefined8 *)(param->field_0).field_1.a;
    pPVar4 = (PClass *)puVar1[1];
    if (pPVar4 == (PClass *)0x0) {
      pPVar4 = (PClass *)(**(code **)*puVar1)(puVar1);
      puVar1[1] = pPVar4;
    }
    bVar5 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar5) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar5 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (bVar5) {
      bVar5 = FMultiBlockThingsIterator::Next
                        ((FMultiBlockThingsIterator *)(puVar1 + 5),(CheckResult *)(puVar1 + 0x3e));
      if (numret < 1) {
        iVar3 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4cd,
                        "int AF_DBlockThingsIterator_Next(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (ret->RegType != '\0') {
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x13f,"void VMReturn::SetInt(int)");
        }
        *(uint *)ret->Location = (uint)bVar5;
        iVar3 = 1;
      }
      return iVar3;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DBlockThingsIterator))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x4cc,
                "int AF_DBlockThingsIterator_Next(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DBlockThingsIterator, Next)
{
	PARAM_SELF_PROLOGUE(DBlockThingsIterator);
	ACTION_RETURN_BOOL(self->Next());
}